

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializer.hpp
# Opt level: O1

bool __thiscall
Diligent::Serializer<(Diligent::SerializerMode)2>::Copy<void_const>
          (Serializer<(Diligent::SerializerMode)2> *this,void *pData,size_t Size)

{
  char (*in_RCX) [22];
  string msg;
  string local_38;
  
  if (this->m_End < this->m_Ptr + Size) {
    FormatString<char[26],char[22]>
              (&local_38,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_Ptr + Size <= m_End",in_RCX);
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"Copy",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/Serializer.hpp"
               ,0x15e);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  this->m_Ptr = this->m_Ptr + Size;
  return true;
}

Assistant:

bool Serializer<SerializerMode::Measure>::Copy(T* pData, size_t Size)
{
    VERIFY_EXPR(m_Ptr + Size <= m_End);
    m_Ptr += Size;
    return true;
}